

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pattern_formatter-inl.h
# Opt level: O0

void __thiscall
spdlog::details::v_formatter<spdlog::details::null_scoped_padder>::format
          (v_formatter<spdlog::details::null_scoped_padder> *this,log_msg *msg,tm *param_3,
          memory_buf_t *dest)

{
  string_view_t view;
  size_t sVar1;
  memory_buf_t *in_RCX;
  long in_RSI;
  long in_RDI;
  null_scoped_padder p;
  char *in_stack_ffffffffffffffd8;
  
  sVar1 = ::fmt::v6::basic_string_view<char>::size((basic_string_view<char> *)(in_RSI + 0x50));
  null_scoped_padder::null_scoped_padder
            ((null_scoped_padder *)&stack0xffffffffffffffdf,sVar1,(padding_info *)(in_RDI + 8),
             in_RCX);
  view.size_ = (size_t)in_RCX;
  view.data_ = in_stack_ffffffffffffffd8;
  fmt_helper::append_string_view(view,*(memory_buf_t **)(in_RSI + 0x58));
  return;
}

Assistant:

void format(const details::log_msg &msg, const std::tm &, memory_buf_t &dest) override
    {
        ScopedPadder p(msg.payload.size(), padinfo_, dest);
        fmt_helper::append_string_view(msg.payload, dest);
    }